

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_decoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeConstrainedMultiParallelogramDecoder
          (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data)

{
  PointAttribute *in_RDI;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffffb8;
  PredictionSchemeWrapDecodingTransform<int,_int> *in_stack_ffffffffffffffc0;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_stack_ffffffffffffffd0;
  bool *pbVar1;
  ValueType *local_28;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeDecoder
            (in_stack_ffffffffffffffd0,in_RDI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (in_RDI->super_GeometryAttribute).buffer_ =
       (DataBuffer *)&PTR__MeshPredictionSchemeConstrainedMultiParallelogramDecoder_0032a510;
  local_28 = &in_RDI->num_unique_entries_;
  pbVar1 = &in_RDI[2].super_GeometryAttribute.normalized_;
  do {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x20c760);
    local_28 = local_28 + 10;
  } while ((bool *)local_28 != pbVar1);
  *(undefined4 *)&in_RDI[2].super_GeometryAttribute.normalized_ = 0;
  return;
}

Assistant:

MeshPredictionSchemeConstrainedMultiParallelogramDecoder(
      const PointAttribute *attribute, const TransformT &transform,
      const MeshDataT &mesh_data)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        selected_mode_(Mode::OPTIMAL_MULTI_PARALLELOGRAM) {}